

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGLDriver::setRenderTargetEx
          (COpenGLDriver *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  COpenGLCoreTexture<irr::video::COpenGLDriver> *texture;
  ushort uVar1;
  ITexture *texture_00;
  pointer ppIVar2;
  COpenGLRenderTarget *renderTarget;
  ulong uVar3;
  bool bVar4;
  undefined4 in_XMM0_Db;
  
  if (target == (IRenderTarget *)0x0) {
    bVar4 = this->field_0x6c1 == '\0';
    if (bVar4) {
      texture_00 = COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   ::getTexture((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                 *)(this->super_CNullDriver).CurrentRenderTarget);
      if (texture_00 != (ITexture *)0x0) {
        texture = (this->CacheHandler->
                  super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  ).TextureCache.Texture[0];
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::STextureCache::set
                  (&(this->CacheHandler->
                    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ).TextureCache,0,texture_00,EST_ACTIVE_ALWAYS);
        glCopyTexSubImage2D(0xde1,0,0,0,0,0,(texture_00->Size).Width,(texture_00->Size).Height);
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::STextureCache::set
                  (&(this->CacheHandler->
                    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ).TextureCache,0,&texture->super_ITexture,EST_ACTIVE_ALWAYS);
      }
    }
    else {
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setFBO(&this->CacheHandler->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,0);
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
              (this,(ulong)(this->super_CNullDriver).ScreenSize.Width,
               (ulong)(this->super_CNullDriver).ScreenSize.Height);
    ppIVar2 = (pointer)0x0;
    uVar3 = 0;
  }
  else {
    if (target->DriverType != EDT_OPENGL) {
      os::Printer::log((Printer *)
                       "Fatal Error: Tried to set a render target not owned by this driver.",
                       (double)CONCAT44(in_XMM0_Db,clearDepth));
      return false;
    }
    bVar4 = this->field_0x6c1 == '\0';
    if (!bVar4) {
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setFBO(&this->CacheHandler->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,*(GLuint *)
                 ((long)&target[1].Textures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4));
      COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::update((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                *)target);
    }
    ppIVar2 = target[1].Textures.m_data.
              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (ulong)ppIVar2 >> 0x20;
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
              (this,(ulong)ppIVar2 & 0xffffffff,uVar3);
  }
  if (((this->super_CNullDriver).CurrentRenderTargetSize.Width != (uint)ppIVar2) ||
     ((this->super_CNullDriver).CurrentRenderTargetSize.Height != (uint)uVar3)) {
    (this->super_CNullDriver).CurrentRenderTargetSize =
         (dimension2d<unsigned_int>)((ulong)ppIVar2 & 0xffffffff | uVar3 << 0x20);
    this->Transformation3DChanged = true;
  }
  (this->super_CNullDriver).CurrentRenderTarget = target;
  uVar1 = clearFlag | 3;
  if (!bVar4) {
    uVar1 = clearFlag;
  }
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x57])
            ((ulong)(uint)clearDepth,this,(ulong)uVar1,(ulong)clearColor.color,clearStencil);
  return true;
}

Assistant:

bool COpenGLDriver::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != EDT_OPENGL) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by this driver.", ELL_ERROR);
		return false;
	}

	bool supportForFBO = (Feature.ColorAttachment > 0);

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGLRenderTarget *renderTarget = static_cast<COpenGLRenderTarget *>(target);

		if (supportForFBO) {
			CacheHandler->setFBO(renderTarget->getBufferID());
			renderTarget->update();
		}

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		if (supportForFBO)
			CacheHandler->setFBO(0);
		else {
			COpenGLRenderTarget *prevRenderTarget = static_cast<COpenGLRenderTarget *>(CurrentRenderTarget);
			COpenGLTexture *renderTargetTexture = static_cast<COpenGLTexture *>(prevRenderTarget->getTexture());

			if (renderTargetTexture) {
				const COpenGLTexture *prevTexture = CacheHandler->getTextureCache()[0];

				CacheHandler->getTextureCache().set(0, renderTargetTexture);

				const core::dimension2d<u32> size = renderTargetTexture->getSize();
				glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, size.Width, size.Height);

				CacheHandler->getTextureCache().set(0, prevTexture);
			}
		}

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	if (!supportForFBO) {
		clearFlag |= ECBF_COLOR;
		clearFlag |= ECBF_DEPTH;
	}

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}